

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH64_hash_t XXH64_digest(XXH64_state_t *state)

{
  ulong len;
  XXH64_hash_t XVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  xxh_u64 xVar5;
  ulong in_RCX;
  long lVar6;
  
  len = state->total_len;
  if (len < 0x20) {
    lVar6 = state->v[2] + 0x27d4eb2f165667c5;
  }
  else {
    XVar1 = state->v[0];
    uVar2 = state->v[1];
    uVar3 = state->v[2];
    uVar4 = state->v[3];
    in_RCX = ((uVar2 * -0x6c158a5880000000 | uVar2 * -0x3d4d51c2d82b14b1 >> 0x21) *
              -0x61c8864e7a143579 ^
             ((XVar1 * -0x6c158a5880000000 | XVar1 * -0x3d4d51c2d82b14b1 >> 0x21) *
              -0x61c8864e7a143579 ^
             (uVar4 << 0x12 | uVar4 >> 0x2e) + (uVar3 << 0xc | uVar3 >> 0x34) +
             (uVar2 << 7 | uVar2 >> 0x39) + (XVar1 << 1 | (ulong)((long)XVar1 < 0))) *
             -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    lVar6 = ((uVar4 * -0x6c158a5880000000 | uVar4 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^ in_RCX) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
            -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  xVar5 = XXH64_finalize(lVar6 + len,(xxh_u8 *)state->mem64,len,(XXH_alignment)in_RCX);
  return xVar5;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH64_digest(XXH_NOESCAPE const XXH64_state_t* state)
{
    xxh_u64 h64;

    if (state->total_len >= 32) {
        h64 = XXH_rotl64(state->v[0], 1) + XXH_rotl64(state->v[1], 7) + XXH_rotl64(state->v[2], 12) + XXH_rotl64(state->v[3], 18);
        h64 = XXH64_mergeRound(h64, state->v[0]);
        h64 = XXH64_mergeRound(h64, state->v[1]);
        h64 = XXH64_mergeRound(h64, state->v[2]);
        h64 = XXH64_mergeRound(h64, state->v[3]);
    } else {
        h64  = state->v[2] /*seed*/ + XXH_PRIME64_5;
    }

    h64 += (xxh_u64) state->total_len;

    return XXH64_finalize(h64, (const xxh_u8*)state->mem64, (size_t)state->total_len, XXH_aligned);
}